

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Prev(Iterator *this)

{
  bool bVar1;
  Node *pNVar2;
  Iterator *this_local;
  
  bVar1 = Valid(this);
  if (!bVar1) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                  ,0xd8,
                  "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::Prev() [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  pNVar2 = FindLessThan(this->list_,&this->node_->key);
  this->node_ = pNVar2;
  if (this->node_ == this->list_->head_) {
    this->node_ = (Node *)0x0;
  }
  return;
}

Assistant:

inline void SkipList<Key, Comparator>::Iterator::Prev() {
  // Instead of using explicit "prev" links, we just search for the
  // last node that falls before key.
  assert(Valid());
  node_ = list_->FindLessThan(node_->key);
  if (node_ == list_->head_) {
    node_ = nullptr;
  }
}